

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionObject.cpp
# Opt level: O0

void __thiscall btCollisionObject::btCollisionObject(btCollisionObject *this)

{
  undefined8 *in_RDI;
  btTransform *in_stack_ffffffffffffffc0;
  btTransform *this_00;
  btScalar local_14;
  btScalar local_10;
  btScalar local_c [3];
  
  *in_RDI = &PTR__btCollisionObject_002e2760;
  this_00 = (btTransform *)(in_RDI + 1);
  btTransform::btTransform(in_stack_ffffffffffffffc0);
  btTransform::btTransform(in_stack_ffffffffffffffc0);
  btVector3::btVector3((btVector3 *)(in_RDI + 0x11));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x13));
  local_c[0] = 1.0;
  local_10 = 1.0;
  local_14 = 1.0;
  btVector3::btVector3((btVector3 *)(in_RDI + 0x15),local_c,&local_10,&local_14);
  *(undefined4 *)(in_RDI + 0x17) = 0;
  *(undefined4 *)((long)in_RDI + 0xbc) = 0x5d5e0b6b;
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 1;
  *(undefined4 *)((long)in_RDI + 0xe4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1d) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0xec) = 1;
  *(undefined4 *)(in_RDI + 0x1e) = 0;
  *(undefined4 *)((long)in_RDI + 0xf4) = 0x3f000000;
  *(undefined4 *)(in_RDI + 0x1f) = 0;
  *(undefined4 *)((long)in_RDI + 0xfc) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 1;
  in_RDI[0x21] = 0;
  *(undefined4 *)(in_RDI + 0x22) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x114) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x23) = 0;
  *(undefined4 *)((long)in_RDI + 0x11c) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  btAlignedObjectArray<const_btCollisionObject_*>::btAlignedObjectArray
            ((btAlignedObjectArray<const_btCollisionObject_*> *)(in_RDI + 0x25));
  *(undefined4 *)(in_RDI + 0x29) = 0;
  btTransform::setIdentity(this_00);
  return;
}

Assistant:

btCollisionObject::btCollisionObject()
	:	m_anisotropicFriction(1.f,1.f,1.f),
	m_hasAnisotropicFriction(false),
	m_contactProcessingThreshold(BT_LARGE_FLOAT),
		m_broadphaseHandle(0),
		m_collisionShape(0),
		m_extensionPointer(0),
		m_rootCollisionShape(0),
		m_collisionFlags(btCollisionObject::CF_STATIC_OBJECT),
		m_islandTag1(-1),
		m_companionId(-1),
		m_activationState1(1),
		m_deactivationTime(btScalar(0.)),
		m_friction(btScalar(0.5)),
		m_restitution(btScalar(0.)),
		m_rollingFriction(0.0f),
		m_internalType(CO_COLLISION_OBJECT),
		m_userObjectPointer(0),
		m_userIndex(-1),
		m_hitFraction(btScalar(1.)),
		m_ccdSweptSphereRadius(btScalar(0.)),
		m_ccdMotionThreshold(btScalar(0.)),
		m_checkCollideWith(false),
		m_updateRevision(0)
{
	m_worldTransform.setIdentity();
}